

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

string * QUtil::utf16_to_utf8(string *__return_storage_ptr__,string *val)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  char *pcVar4;
  pointer pcVar5;
  uint uVar6;
  ulong uVar7;
  QUtil *this;
  uint uVar8;
  ulong uVar9;
  char cVar10;
  bool bVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = val->_M_string_length;
  if (uVar3 < 2) {
LAB_00243c6e:
    bVar11 = false;
    uVar12 = 0;
  }
  else {
    pcVar4 = (val->_M_dataplus)._M_p;
    cVar1 = *pcVar4;
    if (cVar1 == -2) {
      cVar10 = -1;
    }
    else {
      if (cVar1 != -1) goto LAB_00243c6e;
      cVar10 = -2;
    }
    bVar14 = pcVar4[1] == cVar10;
    bVar11 = cVar1 == -1 && bVar14;
    uVar12 = (ulong)((uint)bVar14 * 2);
  }
  uVar12 = uVar12 | 1;
  if (uVar12 < uVar3) {
    uVar7 = 0;
    do {
      uVar13 = uVar12;
      if (!bVar11) {
        uVar13 = uVar12 - 1;
      }
      uVar9 = uVar13;
      if (val->_M_string_length <= uVar13) {
LAB_00243d72:
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
      }
      uVar9 = uVar12 - 1;
      if (!bVar11) {
        uVar9 = uVar12;
      }
      if (val->_M_string_length <= uVar9) goto LAB_00243d72;
      pcVar5 = (val->_M_dataplus)._M_p;
      bVar2 = pcVar5[uVar13];
      cVar1 = pcVar5[uVar9];
      uVar8 = (uint)CONCAT11(bVar2,cVar1);
      uVar6 = bVar2 & 0xfc;
      if (uVar6 == 0xdc) {
        this = (QUtil *)(uVar7 + (uVar8 & 0x3ff));
LAB_00243d12:
        toUTF8_abi_cxx11_(&local_50,this,(ulong)(uVar6 << 8));
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        uVar7 = 0;
      }
      else {
        if (uVar6 != 0xd8) {
          this = (QUtil *)(ulong)CONCAT11(bVar2,cVar1);
          goto LAB_00243d12;
        }
        uVar7 = (ulong)((uVar8 & 0x3ff) * 0x400 + 0x10000);
      }
      uVar12 = uVar12 + 2;
    } while (uVar12 < uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::utf16_to_utf8(std::string const& val)
{
    std::string result;
    // This code uses unsigned long and unsigned short to hold codepoint values. It requires
    // unsigned long to be at least 32 bits and unsigned short to be at least 16 bits, but it will
    // work fine if they are larger.
    unsigned long codepoint = 0L;
    size_t len = val.length();
    size_t start = 0;
    bool is_le = false;
    if (is_utf16(val)) {
        if (static_cast<unsigned char>(val.at(0)) == 0xff) {
            is_le = true;
        }
        start += 2;
    }
    // If the string has an odd number of bytes, the last byte is ignored.
    for (size_t i = start; i + 1 < len; i += 2) {
        // Convert from UTF16-BE.  If we get a malformed codepoint, this code will generate
        // incorrect output without giving a warning.  Specifically, a high codepoint not followed
        // by a low codepoint will be discarded, and a low codepoint not preceded by a high
        // codepoint will just get its low 10 bits output.
        auto msb = is_le ? i + 1 : i;
        auto lsb = is_le ? i : i + 1;
        unsigned short bits = QIntC::to_ushort(
            (static_cast<unsigned char>(val.at(msb)) << 8) +
            static_cast<unsigned char>(val.at(lsb)));
        if ((bits & 0xFC00) == 0xD800) {
            codepoint = 0x10000U + ((bits & 0x3FFU) << 10U);
            continue;
        } else if ((bits & 0xFC00) == 0xDC00) {
            if (codepoint != 0) {
                QTC::TC("qpdf", "QUtil non-trivial UTF-16");
            }
            codepoint += bits & 0x3FF;
        } else {
            codepoint = bits;
        }

        result += QUtil::toUTF8(codepoint);
        codepoint = 0;
    }
    return result;
}